

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterInitializingModeAsync(Federate *this)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  undefined8 uVar2;
  future<bool> *in_RDI;
  handle asyncInfo;
  Modes cmode;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff78;
  memory_order in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Modes *in_stack_ffffffffffffff98;
  atomic<helics::Federate::Modes> *in_stack_ffffffffffffffa0;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_38;
  Modes local_19;
  type *in_stack_fffffffffffffff0;
  future<bool> *pfVar3;
  launch __policy;
  
  if (((ulong)(in_RDI->super___basic_future<bool>)._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 0x1000000000000) != 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)in_RDI);
    message._M_str = (char *)in_stack_ffffffffffffffa0;
    message._M_len = (size_t)in_stack_ffffffffffffff98;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               message);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  pfVar3 = in_RDI;
  local_19 = std::atomic<helics::Federate::Modes>::load
                       ((atomic<helics::Federate::Modes> *)
                        &(in_RDI->super___basic_future<bool>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,seq_cst);
  __policy = (launch)((ulong)pfVar3 >> 0x20);
  if (local_19 == STARTUP) {
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x33febe);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff78);
    bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                       (Modes)((uint)in_stack_ffffffffffffff94 >> 0x18),in_stack_ffffffffffffff90);
    if (bVar1) {
      std::async<helics::Federate::enterInitializingModeAsync()::__0>
                (__policy,in_stack_fffffffffffffff0);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_38);
      std::future<bool>::operator=
                ((future<bool> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_RDI);
      std::future<bool>::~future((future<bool> *)0x33ff2c);
    }
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x33ff52);
  }
  else if ((local_19 != PENDING_INIT) && (local_19 != INITIALIZING)) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)in_RDI);
    message_00._M_str = (char *)in_stack_ffffffffffffffa0;
    message_00._M_len = (size_t)in_stack_ffffffffffffff98;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               message_00);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  return;
}

Assistant:

void Federate::enterInitializingModeAsync()
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto cmode = currentMode.load();
    if (cmode == Modes::STARTUP) {
        auto asyncInfo = asyncCallInfo->lock();
        if (currentMode.compare_exchange_strong(cmode, Modes::PENDING_INIT)) {
            asyncInfo->initFuture = std::async(std::launch::async, [this]() {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }
                return coreObject->enterInitializingMode(fedID);
            });
        }
    } else if (cmode == Modes::PENDING_INIT) {
        return;
    } else if (cmode != Modes::INITIALIZING) {
        // if we are already in initialization do nothing
        throw(InvalidFunctionCall("cannot transition from current mode to initializing mode"));
    }
}